

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_growable_writer_flush(mpack_writer_t *writer,char *data,size_t count)

{
  char *pcVar1;
  ulong uVar2;
  size_t __n;
  ulong __size;
  size_t sVar3;
  char *__dest;
  
  pcVar1 = writer->buffer;
  if (pcVar1 == data) {
    if ((long)writer->current - (long)data == count) {
      return;
    }
    writer->current = pcVar1 + count;
    __size = (long)writer->end - (long)pcVar1;
    __n = 0;
    uVar2 = count;
  }
  else {
    sVar3 = (long)writer->current - (long)pcVar1;
    __size = (long)writer->end - (long)pcVar1;
    uVar2 = count + sVar3;
    __n = count;
    count = sVar3;
  }
  do {
    __size = __size * 2;
  } while (__size < uVar2);
  pcVar1 = (char *)realloc(pcVar1,__size);
  if (pcVar1 != (char *)0x0) {
    __dest = pcVar1 + count;
    writer->current = __dest;
    writer->buffer = pcVar1;
    writer->end = pcVar1 + __size;
    if (__n != 0) {
      memcpy(__dest,data,__n);
      writer->current = __dest + __n;
    }
    return;
  }
  mpack_writer_flag_error(writer,mpack_error_memory);
  return;
}

Assistant:

static void mpack_growable_writer_flush(mpack_writer_t* writer, const char* data, size_t count) {

    // This is an intrusive flush function which modifies the writer's buffer
    // in response to a flush instead of emptying it in order to add more
    // capacity for data. This removes the need to copy data from a fixed buffer
    // into a growable one, improving performance.
    //
    // There are three ways flush can be called:
    //   - flushing the buffer during writing (used is zero, count is all data, data is buffer)
    //   - flushing extra data during writing (used is all flushed data, count is extra data, data is not buffer)
    //   - flushing during teardown (used and count are both all flushed data, data is buffer)
    //
    // In the first two cases, we grow the buffer by at least double, enough
    // to ensure that new data will fit. We ignore the teardown flush.

    if (data == writer->buffer) {

        // teardown, do nothing
        if (mpack_writer_buffer_used(writer) == count)
            return;

        // otherwise leave the data in the buffer and just grow
        writer->current = writer->buffer + count;
        count = 0;
    }

    size_t used = mpack_writer_buffer_used(writer);
    size_t size = mpack_writer_buffer_size(writer);

    mpack_log("flush size %i used %i data %p buffer %p\n",
            (int)count, (int)used, data, writer->buffer);

    mpack_assert(data == writer->buffer || used + count > size,
            "extra flush for %i but there is %i space left in the buffer! (%i/%i)",
            (int)count, (int)mpack_writer_buffer_left(writer), (int)used, (int)size);

    // grow to fit the data
    // TODO: this really needs to correctly test for overflow
    size_t new_size = size * 2;
    while (new_size < used + count)
        new_size *= 2;

    mpack_log("flush growing buffer size from %i to %i\n", (int)size, (int)new_size);

    // grow the buffer
    char* new_buffer = (char*)mpack_realloc(writer->buffer, used, new_size);
    if (new_buffer == NULL) {
        mpack_writer_flag_error(writer, mpack_error_memory);
        return;
    }
    writer->current = new_buffer + used;
    writer->buffer = new_buffer;
    writer->end = writer->buffer + new_size;

    // append the extra data
    if (count > 0) {
        mpack_memcpy(writer->current, data, count);
        writer->current += count;
    }

    mpack_log("new buffer %p, used %i\n", new_buffer, (int)mpack_writer_buffer_used(writer));
}